

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

bool __thiscall
soul::SourceCodeOperations::reparse
          (SourceCodeOperations *this,CompileMessageList *messageList,CodeLocation *code)

{
  bool bVar1;
  Namespace *pNVar2;
  pool_ref *this_00;
  ModuleBase *m_00;
  AbortCompilationException anon_var_0;
  pool_ref<soul::AST::ModuleBase> *m;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_80;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  *local_68;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  *__range2;
  undefined1 local_48 [8];
  CompileMessageHandler handler;
  CodeLocation *code_local;
  CompileMessageList *messageList_local;
  SourceCodeOperations *this_local;
  
  handler.lastHandler = (CompileMessageHandler *)code;
  clear(this);
  CodeLocation::operator=(&this->source,code);
  CompileMessageHandler::CompileMessageHandler((CompileMessageHandler *)local_48,messageList);
  pNVar2 = AST::createRootNamespace(&this->allocator);
  pool_ptr<soul::AST::Namespace>::pool_ptr<soul::AST::Namespace,void>
            ((pool_ptr<soul::AST::Namespace> *)&__range2,pNVar2);
  (this->topLevelNamespace).object = (Namespace *)__range2;
  pool_ptr<soul::AST::Namespace>::~pool_ptr((pool_ptr<soul::AST::Namespace> *)&__range2);
  CodeLocation::CodeLocation((CodeLocation *)&__begin2,code);
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*(&this->topLevelNamespace);
  Compiler::parseTopLevelDeclarations(&local_80,&this->allocator,(CodeLocation *)&__begin2,pNVar2);
  CodeLocation::~CodeLocation((CodeLocation *)&__begin2);
  local_68 = &local_80;
  __end2 = std::
           vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
           ::begin(local_68);
  m = (pool_ref<soul::AST::ModuleBase> *)
      std::
      vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ::end(local_68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
                                *)&m);
    if (!bVar1) break;
    this_00 = (pool_ref *)
              __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
              ::operator*(&__end2);
    m_00 = pool_ref::operator_cast_to_ModuleBase_(this_00);
    recurseFindingModules(this,m_00);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ::~vector(&local_80);
  CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)local_48);
  bVar1 = CompileMessageList::hasErrors(messageList);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool SourceCodeOperations::reparse (CompileMessageList& messageList, CodeLocation code)
{
    clear();
    source = code;

    try
    {
        CompileMessageHandler handler (messageList);
        topLevelNamespace = AST::createRootNamespace (allocator);

        for (auto& m : Compiler::parseTopLevelDeclarations (allocator, std::move (code), *topLevelNamespace))
            recurseFindingModules (m);
    }
    catch (AbortCompilationException)
    {
        clear();
    }

    return ! messageList.hasErrors();
}